

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdc.c
# Opt level: O3

void pcut_str_error(int error,char *buffer,int size)

{
  char *pcVar1;
  char *__src;
  
  pcVar1 = strerror(error);
  __src = "(strerror failure)";
  if (pcVar1 != (char *)0x0) {
    __src = pcVar1;
  }
  strncpy(buffer,__src,(long)size - 1);
  buffer[(long)size + -1] = '\0';
  return;
}

Assistant:

void pcut_str_error(int error, char *buffer, int size) {
	const char *str = strerror(error);
	if (str == NULL) {
		str = "(strerror failure)";
	}
	strncpy(buffer, str, size - 1);
	/* Ensure correct termination. */
	buffer[size - 1] = 0;
}